

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void llvm::APInt::tcShiftRight(WordType *Dst,uint Words,uint Count)

{
  uint uVar1;
  sbyte sVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  
  if (Count != 0) {
    uVar3 = Count >> 6;
    if (Words <= Count >> 6) {
      uVar3 = Words;
    }
    uVar7 = Words - uVar3;
    if ((Count & 0x3f) == 0) {
      memmove(Dst,Dst + uVar3,(ulong)(uVar7 * 8));
    }
    else {
      sVar2 = (sbyte)(Count & 0x3f);
      uVar1 = uVar3;
      for (lVar5 = 0; uVar4 = uVar1 + 1, (ulong)uVar7 * 8 - lVar5 != 0; lVar5 = lVar5 + 8) {
        uVar6 = Dst[uVar1] >> sVar2;
        *(ulong *)((long)Dst + lVar5) = uVar6;
        if (Words != uVar4) {
          *(WordType *)((long)Dst + lVar5) = Dst[uVar4] << (0x40U - sVar2 & 0x3f) | uVar6;
        }
        uVar1 = uVar4;
      }
    }
    memset(Dst + uVar7,0,(ulong)(uVar3 << 3));
    return;
  }
  return;
}

Assistant:

void APInt::tcShiftRight(WordType *Dst, unsigned Words, unsigned Count) {
  // Don't bother performing a no-op shift.
  if (!Count)
    return;

  // WordShift is the inter-part shift; BitShift is the intra-part shift.
  unsigned WordShift = std::min(Count / APINT_BITS_PER_WORD, Words);
  unsigned BitShift = Count % APINT_BITS_PER_WORD;

  unsigned WordsToMove = Words - WordShift;
  // Fastpath for moving by whole words.
  if (BitShift == 0) {
    std::memmove(Dst, Dst + WordShift, WordsToMove * APINT_WORD_SIZE);
  } else {
    for (unsigned i = 0; i != WordsToMove; ++i) {
      Dst[i] = Dst[i + WordShift] >> BitShift;
      if (i + 1 != WordsToMove)
        Dst[i] |= Dst[i + WordShift + 1] << (APINT_BITS_PER_WORD - BitShift);
    }
  }

  // Fill in the remainder with 0s.
  std::memset(Dst + WordsToMove, 0, WordShift * APINT_WORD_SIZE);
}